

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
          (string *__return_storage_ptr__,cmGeneratorTarget *this)

{
  string *a;
  string *args;
  cmGeneratorTarget *this_local;
  string *dir;
  
  a = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LocalGenerator);
  args = GetName_abi_cxx11_(this);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[13],std::__cxx11::string_const&>
            (__return_storage_ptr__,a,(char (*) [13])0x1031330,args);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,".dir");
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetSupportDirectory() const
{
  std::string dir = cmStrCat(this->LocalGenerator->GetCurrentBinaryDirectory(),
                             "/CMakeFiles/", this->GetName());
#if defined(__VMS)
  dir += "_dir";
#else
  dir += ".dir";
#endif
  return dir;
}